

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::IsInsufficient
          (MP<135UL,_GF2::MOLex<135UL>_> *this,WW<135UL> *vars)

{
  bool bVar1;
  WW<135UL> *pWVar2;
  WW<135UL> *in_RSI;
  const_iterator iter;
  WW<135UL> mask;
  list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *in_stack_ffffffffffffffa8;
  WW<135UL> *in_stack_ffffffffffffffb0;
  _Self local_40;
  _Self local_38;
  WW<135UL> local_30;
  WW<135UL> *local_18;
  
  local_18 = in_RSI;
  WW<135UL>::WW((WW<135UL> *)0x17bb22);
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::begin
                 (in_stack_ffffffffffffffa8);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                   (in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      return true;
    }
    in_stack_ffffffffffffffb0 =
         &std::_List_const_iterator<GF2::MM<135UL>_>::operator*
                    ((_List_const_iterator<GF2::MM<135UL>_> *)in_stack_ffffffffffffffb0)->
          super_WW<135UL>;
    pWVar2 = WW<135UL>::operator=(&local_30,local_18);
    pWVar2 = WW<135UL>::operator&=(pWVar2,in_stack_ffffffffffffffb0);
    bVar1 = WW<135UL>::IsAllZero(pWVar2);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<135UL>_>::operator++(&local_38);
  }
  return false;
}

Assistant:

bool IsInsufficient(const WW<_n>& vars) const
	{
		WW<_n> mask;
		for (const_iterator iter = begin(); iter != end(); ++iter)
			if (!((mask = vars) &= *iter).IsAllZero())
				return false;
		return true;
	}